

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

bool __thiscall UniValue::pushKVs(UniValue *this,UniValue *obj)

{
  size_type sVar1;
  const_reference key;
  const_reference val_;
  ulong local_28;
  size_t i;
  UniValue *obj_local;
  UniValue *this_local;
  
  if ((this->typ == VOBJ) && (obj->typ == VOBJ)) {
    local_28 = 0;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&obj->keys);
      if (sVar1 <= local_28) break;
      key = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&obj->keys,local_28);
      val_ = std::vector<UniValue,_std::allocator<UniValue>_>::at(&obj->values,local_28);
      __pushKV(this,key,val_);
      local_28 = local_28 + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UniValue::pushKVs(const UniValue& obj)
{
    if (typ != VOBJ || obj.typ != VOBJ)
        return false;

    for (size_t i = 0; i < obj.keys.size(); i++)
        __pushKV(obj.keys[i], obj.values.at(i));

    return true;
}